

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixShmLock(sqlite3_file *fd,int ofst,int n,int flags)

{
  long lVar1;
  int *piVar2;
  ushort *puVar3;
  ushort uVar4;
  sqlite3_io_methods *psVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ushort uVar13;
  uint uVar14;
  
  psVar5 = fd[8].pMethods;
  if (psVar5 == (sqlite3_io_methods *)0x0) {
    return 0x140a;
  }
  lVar6 = *(long *)psVar5;
  if (lVar6 == 0) {
    return 0x140a;
  }
  iVar8 = n + ofst;
  uVar14 = 1 << ((byte)ofst & 0x1f);
  if (*(sqlite3_mutex **)(lVar6 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar6 + 8));
  }
  lVar1 = lVar6 + 0x40;
  uVar11 = (1 << ((byte)iVar8 & 0x1f)) - uVar14;
  uVar13 = (ushort)uVar11;
  if ((flags & 1U) == 0) {
    if ((flags & 4U) == 0) {
      iVar12 = 0;
      bVar7 = 0 < n;
      if (0 < n) {
        lVar10 = (long)ofst;
        uVar14 = ofst;
        do {
          if (((*(ushort *)((long)&psVar5->xRead + 4) >> (uVar14 & 0x1f) & 1) == 0) &&
             (*(int *)(lVar1 + lVar10 * 4) != 0)) {
            iVar12 = 5;
            break;
          }
          lVar10 = lVar10 + 1;
          uVar14 = uVar14 + 1;
          bVar7 = lVar10 < iVar8;
        } while (lVar10 < iVar8);
      }
      if (!bVar7) {
        uVar14 = *(uint *)((fd[2].pMethods)->xLock + 0x18);
        if ((int)uVar14 < 0) {
          iVar12 = 0;
        }
        else {
          iVar12 = (*aSyscall[7].pCurrent)((ulong)uVar14,6);
          iVar12 = (uint)(iVar12 == -1) * 5;
        }
        if (iVar12 == 0) {
          puVar3 = (ushort *)((long)&psVar5->xRead + 4);
          *puVar3 = *puVar3 | uVar13;
          iVar12 = 0;
          if (0 < n) {
            iVar9 = ofst + 1;
            if (ofst + 1 < iVar8) {
              iVar9 = iVar8;
            }
            memset((void *)(lVar6 + (long)ofst * 4 + 0x40),0xff,(ulong)(uint)(~ofst + iVar9) * 4 + 4
                  );
          }
        }
      }
      goto LAB_00146552;
    }
    iVar12 = 0;
    if ((uVar11 & *(ushort *)((long)&psVar5->xRead + 2)) != 0) goto LAB_00146552;
    iVar8 = *(int *)(lVar1 + (long)ofst * 4);
    if (iVar8 < 0) {
      iVar12 = 5;
    }
    else {
      iVar12 = 0;
      if (iVar8 == 0) {
        iVar12 = unixShmSystemLock((unixFile *)fd,0,ofst + 0x78,n);
      }
    }
    if (iVar12 != 0) goto LAB_00146552;
    puVar3 = (ushort *)((long)&psVar5->xRead + 2);
    *puVar3 = *puVar3 | uVar13;
    piVar2 = (int *)(lVar1 + (long)ofst * 4);
    *piVar2 = *piVar2 + 1;
  }
  else {
    uVar4 = *(ushort *)((long)&psVar5->xRead + 2);
    if ((uVar11 & (*(ushort *)((long)&psVar5->xRead + 4) | uVar4)) != 0) {
      if (n < 1) {
LAB_0014639b:
        if (*(int *)((fd[2].pMethods)->xLock + 0x18) < 0) {
          iVar12 = 0;
        }
        else {
          iVar8 = (*aSyscall[7].pCurrent)();
          iVar12 = (uint)(iVar8 == -1) * 5;
        }
        if (iVar12 == 0) {
          iVar12 = 0;
          memset((void *)(lVar1 + (long)ofst * 4),0,(long)n << 2);
        }
      }
      else {
        lVar10 = (long)ofst;
        bVar7 = true;
        do {
          if ((int)(uint)((uVar4 >> ((uint)lVar10 & 0x1f) & 1) != 0) < *(int *)(lVar1 + lVar10 * 4))
          {
            bVar7 = false;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar8);
        if (bVar7) goto LAB_0014639b;
        iVar12 = 0;
        if ((uVar14 & uVar4) != 0) {
          piVar2 = (int *)(lVar1 + (long)ofst * 4);
          *piVar2 = *piVar2 + -1;
        }
      }
      if (iVar12 == 0) {
        puVar3 = (ushort *)((long)&psVar5->xRead + 4);
        *puVar3 = *puVar3 & ~uVar13;
        puVar3 = (ushort *)((long)&psVar5->xRead + 2);
        *puVar3 = *puVar3 & ~uVar13;
      }
      goto LAB_00146552;
    }
  }
  iVar12 = 0;
LAB_00146552:
  if (*(sqlite3_mutex **)(lVar6 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar6 + 8));
  }
  return iVar12;
}

Assistant:

static int unixShmLock(
  sqlite3_file *fd,          /* Database file holding the shared memory */
  int ofst,                  /* First lock to acquire or release */
  int n,                     /* Number of locks to acquire or release */
  int flags                  /* What to do with the lock */
){
  unixFile *pDbFd = (unixFile*)fd;      /* Connection holding shared memory */
  unixShm *p;                           /* The shared memory being locked */
  unixShmNode *pShmNode;                /* The underlying file iNode */
  int rc = SQLITE_OK;                   /* Result code */
  u16 mask;                             /* Mask of locks to take or release */
  int *aLock;

  p = pDbFd->pShm;
  if( p==0 ) return SQLITE_IOERR_SHMLOCK;
  pShmNode = p->pShmNode;
  if( NEVER(pShmNode==0) ) return SQLITE_IOERR_SHMLOCK;
  aLock = pShmNode->aLock;

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( ofst>=0 && ofst+n<=SQLITE_SHM_NLOCK );
  assert( n>=1 );
  assert( flags==(SQLITE_SHM_LOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_EXCLUSIVE) );
  assert( n==1 || (flags & SQLITE_SHM_EXCLUSIVE)!=0 );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Check that, if this to be a blocking lock, no locks that occur later
  ** in the following list than the lock being obtained are already held:
  **
  **   1. Checkpointer lock (ofst==1).
  **   2. Write lock (ofst==0).
  **   3. Read locks (ofst>=3 && ofst<SQLITE_SHM_NLOCK).
  **
  ** In other words, if this is a blocking lock, none of the locks that
  ** occur later in the above list than the lock being obtained may be
  ** held.
  **
  ** It is not permitted to block on the RECOVER lock.
  */
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  assert( (flags & SQLITE_SHM_UNLOCK) || pDbFd->iBusyTimeout==0 || (
         (ofst!=2)                                   /* not RECOVER */
      && (ofst!=1 || (p->exclMask|p->sharedMask)==0)
      && (ofst!=0 || (p->exclMask|p->sharedMask)<3)
      && (ofst<3  || (p->exclMask|p->sharedMask)<(1<<ofst))
  ));
#endif

  mask = (1<<(ofst+n)) - (1<<ofst);
  assert( n>1 || mask==(1<<ofst) );
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  assert( assertLockingArrayOk(pShmNode) );
  if( flags & SQLITE_SHM_UNLOCK ){
    if( (p->exclMask|p->sharedMask) & mask ){
      int ii;
      int bUnlock = 1;

      for(ii=ofst; ii<ofst+n; ii++){
        if( aLock[ii]>((p->sharedMask & (1<<ii)) ? 1 : 0) ){
          bUnlock = 0;
        }
      }

      if( bUnlock ){
        rc = unixShmSystemLock(pDbFd, F_UNLCK, ofst+UNIX_SHM_BASE, n);
        if( rc==SQLITE_OK ){
          memset(&aLock[ofst], 0, sizeof(int)*n);
        }
      }else if( ALWAYS(p->sharedMask & (1<<ofst)) ){
        assert( n==1 && aLock[ofst]>1 );
        aLock[ofst]--;
      }

      /* Undo the local locks */
      if( rc==SQLITE_OK ){
        p->exclMask &= ~mask;
        p->sharedMask &= ~mask;
      }
    }
  }else if( flags & SQLITE_SHM_SHARED ){
    assert( n==1 );
    assert( (p->exclMask & (1<<ofst))==0 );
    if( (p->sharedMask & mask)==0 ){
      if( aLock[ofst]<0 ){
        rc = SQLITE_BUSY;
      }else if( aLock[ofst]==0 ){
        rc = unixShmSystemLock(pDbFd, F_RDLCK, ofst+UNIX_SHM_BASE, n);
      }

      /* Get the local shared locks */
      if( rc==SQLITE_OK ){
        p->sharedMask |= mask;
        aLock[ofst]++;
      }
    }
  }else{
    /* Make sure no sibling connections hold locks that will block this
    ** lock.  If any do, return SQLITE_BUSY right away.  */
    int ii;
    for(ii=ofst; ii<ofst+n; ii++){
      assert( (p->sharedMask & mask)==0 );
      if( ALWAYS((p->exclMask & (1<<ii))==0) && aLock[ii] ){
        rc = SQLITE_BUSY;
        break;
      }
    }

    /* Get the exclusive locks at the system level. Then if successful
    ** also update the in-memory values. */
    if( rc==SQLITE_OK ){
      rc = unixShmSystemLock(pDbFd, F_WRLCK, ofst+UNIX_SHM_BASE, n);
      if( rc==SQLITE_OK ){
        assert( (p->sharedMask & mask)==0 );
        p->exclMask |= mask;
        for(ii=ofst; ii<ofst+n; ii++){
          aLock[ii] = -1;
        }
      }
    }
  }
  assert( assertLockingArrayOk(pShmNode) );
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  OSTRACE(("SHM-LOCK shmid-%d, pid-%d got %03x,%03x\n",
           p->id, osGetpid(0), p->sharedMask, p->exclMask));
  return rc;
}